

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
          (InternalMetadata *this)

{
  void *pvVar1;
  
  pvVar1 = (void *)(this->ptr_ & 0xfffffffffffffffe);
  if (pvVar1 != (void *)0x0) {
    if (*(long **)((long)pvVar1 + 8) != (long *)((long)pvVar1 + 0x18)) {
      operator_delete(*(long **)((long)pvVar1 + 8),*(long *)((long)pvVar1 + 0x18) + 1);
    }
  }
  operator_delete(pvVar1,0x28);
  this->ptr_ = 0;
  return;
}

Assistant:

PROTOBUF_NOINLINE void DeleteOutOfLineHelper() {
    delete PtrValue<Container<T>>();
    // TODO:  This store is load-bearing.  Since we are destructing
    // the message at this point, see if we can eliminate it.
    ptr_ = 0;
  }